

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
md::ROM::get_bytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                  ROM *this,uint32_t begin,uint32_t end)

{
  uint8_t local_39;
  uint32_t local_38;
  uint32_t addr;
  undefined1 local_21;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t end_local;
  uint32_t begin_local;
  ROM *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *output;
  
  local_21 = 0;
  local_20 = end;
  local_1c = begin;
  _end_local = this;
  this_local = (ROM *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,(ulong)(local_20 - local_1c));
  for (local_38 = local_1c; local_38 < local_20; local_38 = local_38 + 1) {
    local_39 = get_byte(this,local_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> ROM::get_bytes(uint32_t begin, uint32_t end) const
{
    std::vector<uint8_t> output;
    output.reserve(end - begin);

    for (uint32_t addr = begin; addr < end; addr += 0x1)
        output.emplace_back(this->get_byte(addr));

    return output;
}